

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox_safe.cpp
# Opt level: O0

ssize_t __thiscall
zmq::mailbox_safe_t::recv(mailbox_safe_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  __pid_t _Var1;
  ulong uVar2;
  char *pcVar3;
  int *piVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  bool bVar5;
  bool ok;
  char *errstr;
  int rc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  uint local_4;
  
  uVar2 = ypipe_t<zmq::command_t,_16>::read(&this->_cpipe,__fd,__buf,__n);
  if ((uVar2 & 1) == 0) {
    if ((int)__buf == 0) {
      mutex_t::unlock((mutex_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      mutex_t::lock((mutex_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      __buf_00 = extraout_RDX;
    }
    else {
      _Var1 = condition_variable_t::wait(&this->_cond_var,this->_sync);
      __buf_00 = extraout_RDX_00;
      if (_Var1 == -1) {
        piVar4 = __errno_location();
        bVar5 = true;
        if (*piVar4 != 0xb) {
          piVar4 = __errno_location();
          bVar5 = *piVar4 == 4;
        }
        if (!bVar5) {
          piVar4 = __errno_location();
          pcVar3 = strerror(*piVar4);
          fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mailbox_safe.cpp"
                  ,0x6f);
          fflush(_stderr);
          zmq_abort((char *)0x22a63a);
        }
        local_4 = 0xffffffff;
        goto LAB_0022a685;
      }
    }
    uVar2 = ypipe_t<zmq::command_t,_16>::read(&this->_cpipe,__fd,__buf_00,__n);
    if ((uVar2 & 1) == 0) {
      piVar4 = __errno_location();
      *piVar4 = 0xb;
      local_4 = 0xffffffff;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
LAB_0022a685:
  return (ulong)local_4;
}

Assistant:

int zmq::mailbox_safe_t::recv (command_t *cmd_, int timeout_)
{
    //  Try to get the command straight away.
    if (_cpipe.read (cmd_))
        return 0;

    //  If the timeout is zero, it will be quicker to release the lock, giving other a chance to send a command
    //  and immediately relock it.
    if (timeout_ == 0) {
        _sync->unlock ();
        _sync->lock ();
    } else {
        //  Wait for signal from the command sender.
        const int rc = _cond_var.wait (_sync, timeout_);
        if (rc == -1) {
            errno_assert (errno == EAGAIN || errno == EINTR);
            return -1;
        }
    }

    //  Another thread may already fetch the command
    const bool ok = _cpipe.read (cmd_);

    if (!ok) {
        errno = EAGAIN;
        return -1;
    }

    return 0;
}